

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flip_book_group.cpp
# Opt level: O3

void flip_book_copy(Am_Object *self)

{
  Am_Object *__s;
  ulong *puVar1;
  bool bVar2;
  unsigned_short uVar3;
  Am_Object_Demon *pAVar4;
  Am_Value *pAVar5;
  Am_Wrapper *pAVar6;
  ulong uVar7;
  long lVar8;
  Am_Object *pAVar9;
  Am_Object current_component;
  Am_Value_List components;
  Am_Object part;
  Am_Part_Iterator parts;
  Am_Value_List new_components;
  Am_Object in_stack_ffffffffffffff68;
  Am_Value_List local_90;
  Am_Object *local_80;
  ulong local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Part_Iterator local_60;
  ulong *local_50;
  Am_Object local_48;
  Am_Value_List local_40;
  
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_90);
  pAVar4 = Am_Demon_Set::Get_Object_Demon((Am_Demon_Set *)&local_90,Am_COPY_OBJ);
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)&local_90);
  Am_Object::Am_Object(&local_48,self);
  (*pAVar4)(in_stack_ffffffffffffff68);
  Am_Object::~Am_Object(&local_48);
  Am_Value_List::Am_Value_List(&local_90);
  local_80 = self;
  pAVar5 = Am_Object::Get(self,0x83,0);
  Am_Value_List::operator=(&local_90,pAVar5);
  Am_Value_List::Am_Value_List(&local_40);
  Am_Object::Am_Object(&local_68,local_80);
  Am_Part_Iterator::Am_Part_Iterator(&local_60,&local_68);
  Am_Object::~Am_Object(&local_68);
  uVar3 = Am_Part_Iterator::Length(&local_60);
  bVar2 = Am_Value_List::Empty(&local_90);
  if (uVar3 == 0 || bVar2) {
    pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_(&Am_No_Value_List);
    Am_Object::Set(local_80,0x83,pAVar6,0);
  }
  else {
    local_50 = (ulong *)operator_new__((ulong)uVar3 * 0x10 + 8);
    *local_50 = (ulong)((uint)uVar3 + (uint)uVar3);
    __s = (Am_Object *)(local_50 + 1);
    memset(__s,0,(ulong)uVar3 * 0x10);
    local_70.data = (Am_Object_Data *)0x0;
    Am_Part_Iterator::Start(&local_60);
    pAVar9 = __s;
    local_78 = (ulong)uVar3;
    while (bVar2 = Am_Part_Iterator::Last(&local_60), !bVar2) {
      Am_Part_Iterator::Get((Am_Part_Iterator *)&stack0xffffffffffffff68);
      Am_Object::operator=(&local_70,(Am_Object *)&stack0xffffffffffffff68);
      Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff68);
      Am_Object::operator=(pAVar9 + uVar3,&local_70);
      pAVar5 = Am_Object::Get(&local_70,0xc,0);
      Am_Object::operator=(pAVar9,pAVar5);
      pAVar9 = pAVar9 + 1;
      Am_Part_Iterator::Next(&local_60);
    }
    Am_Value_List::Start(&local_90);
    uVar7 = (ulong)(uint)((int)local_78 * 8);
    local_78 = (long)local_50 + uVar7;
    while (bVar2 = Am_Value_List::Last(&local_90), puVar1 = local_50, !bVar2) {
      pAVar5 = Am_Value_List::Get(&local_90);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffff68,pAVar5);
      lVar8 = -8;
      pAVar9 = __s;
      do {
        bVar2 = Am_Object::operator==((Am_Object *)&stack0xffffffffffffff68,pAVar9);
        if (bVar2) {
          pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)(local_78 - lVar8));
          Am_Value_List::Add(&local_40,pAVar6,Am_TAIL,true);
          break;
        }
        lVar8 = lVar8 + -8;
        pAVar9 = pAVar9 + 1;
      } while (uVar7 + 8 + lVar8 != 0);
      Am_Value_List::Next(&local_90);
    }
    if (*local_50 != 0) {
      lVar8 = *local_50 << 3;
      do {
        Am_Object::~Am_Object((Am_Object *)((long)puVar1 + lVar8));
        lVar8 = lVar8 + -8;
      } while (lVar8 != 0);
    }
    operator_delete__(puVar1);
    pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_40);
    Am_Object::Set(local_80,0x83,pAVar6,0);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff68);
    Am_Object::~Am_Object(&local_70);
  }
  Am_Object::~Am_Object(&local_60.owner);
  Am_Object::~Am_Object(&local_60.current);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Value_List::~Am_Value_List(&local_90);
  return;
}

Assistant:

static void
flip_book_copy(Am_Object self)
{
  Am_Object_Demon *copy_demon = ((Am_Object_Advanced &)Am_Aggregate)
                                    .Get_Demons()
                                    .Get_Object_Demon(Am_COPY_OBJ);
  copy_demon(self);

  Am_Value_List components;
  components = self.Get(Am_FLIP_BOOK_PARTS);
  Am_Value_List new_components;
  Am_Part_Iterator parts = self;
  int parts_length = parts.Length();
  if (components.Empty() || (parts_length == 0)) {
    self.Set(Am_FLIP_BOOK_PARTS, Am_No_Value_List);
    return;
  }
  Am_Object *part_map = new Am_Object[parts_length * 2];
  Am_Object part;
  int i;
  for (i = 0, parts.Start(); !parts.Last(); ++i, parts.Next()) {
    part = parts.Get();
    part_map[i + parts_length] = part;
    part_map[i] = part.Get(Am_SOURCE_OF_COPY);
  }
  Am_Object current_component;
  for (components.Start(); !components.Last(); components.Next()) {
    current_component = components.Get();
    for (i = 0; i < parts_length; ++i)
      if (current_component == part_map[i]) {
        new_components.Add(part_map[i + parts_length]);
        break;
      }
  }
  delete[] part_map;
  self.Set(Am_FLIP_BOOK_PARTS, new_components);
}